

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app2.cpp
# Opt level: O2

void __thiscall FancyInteger::print_fancy(FancyInteger *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(this->super_Integer).value);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print_fancy() // member-function
    {
        std::cout << "----------------" << std::endl;
        std::cout << value << std::endl;
        std::cout << "----------------" << std::endl;
    }